

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Btree_ComparableMultiset_Test::TestBody
          (Btree_ComparableMultiset_Test *this)

{
  allocator<int> *this_00;
  initializer_list<int> iVar1;
  initializer_list<int> iVar2;
  bool bVar3;
  char *pcVar4;
  AssertHelper local_150;
  Message local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_5;
  Message local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_4;
  Message local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_3;
  Message local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_2;
  Message local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Message local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  int local_88 [2];
  iterator local_80;
  size_type local_78;
  undefined1 local_70 [8];
  btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_> s2;
  allocator<int> local_42;
  key_compare local_41;
  int local_40 [2];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_> s1;
  Btree_ComparableMultiset_Test *this_local;
  
  local_40[0] = 1;
  local_40[1] = 2;
  local_38 = local_40;
  local_30 = 2;
  s1.
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
  .tree_.size_ = (size_type)this;
  std::allocator<int>::allocator(&local_42);
  iVar2._M_len = local_30;
  iVar2._M_array = local_38;
  btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>::btree_multiset_container
            ((btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_> *)local_28,iVar2,&local_41
             ,&local_42);
  std::allocator<int>::~allocator(&local_42);
  local_88[0] = 2;
  local_88[1] = 3;
  local_80 = local_88;
  local_78 = 2;
  this_00 = (allocator<int> *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 6);
  std::allocator<int>::allocator(this_00);
  iVar1._M_len = local_78;
  iVar1._M_array = local_80;
  btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>::btree_multiset_container
            ((btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_> *)local_70,iVar1,
             (key_compare *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7),this_00);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 6));
  testing::internal::
  CmpHelperLT<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>>
            ((internal *)local_a0,"s1","s2",
             (btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_> *)local_28,
             (btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_> *)local_70);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar3) {
    testing::Message::Message(&local_a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x6e7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  testing::internal::
  CmpHelperLE<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>>
            ((internal *)local_c0,"s1","s2",
             (btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_> *)local_28,
             (btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_> *)local_70);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar3) {
    testing::Message::Message(&local_c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x6e8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  testing::internal::
  CmpHelperLE<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>>
            ((internal *)local_e0,"s1","s1",
             (btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_> *)local_28,
             (btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_> *)local_28);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar3) {
    testing::Message::Message(&local_e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x6e9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  testing::internal::
  CmpHelperGT<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>>
            ((internal *)local_100,"s2","s1",
             (btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_> *)local_70,
             (btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_> *)local_28);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar3) {
    testing::Message::Message(&local_108);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x6ea,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  testing::internal::
  CmpHelperGE<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>>
            ((internal *)local_120,"s2","s1",
             (btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_> *)local_70,
             (btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_> *)local_28);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar3) {
    testing::Message::Message(&local_128);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x6eb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  testing::internal::
  CmpHelperGE<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>>
            ((internal *)local_140,"s1","s1",
             (btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_> *)local_28,
             (btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_> *)local_28);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar3) {
    testing::Message::Message(&local_148);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x6ec,pcVar4);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>::~btree_multiset
            ((btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_> *)local_70);
  btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>::~btree_multiset
            ((btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

TEST(Btree, ComparableMultiset) {
        phmap::btree_multiset<int> s1 = {1, 2};
        phmap::btree_multiset<int> s2 = {2, 3};
        EXPECT_LT(s1, s2);
        EXPECT_LE(s1, s2);
        EXPECT_LE(s1, s1);
        EXPECT_GT(s2, s1);
        EXPECT_GE(s2, s1);
        EXPECT_GE(s1, s1);
    }